

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O1

void __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Coalesce
          (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *C,
          IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *D,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k2)

{
  vector<char,_std::allocator<char>_> *__x;
  vector<Addr,_std::allocator<Addr>_> *__x_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x_01;
  vector<char,_std::allocator<char>_> *__x_02;
  vector<Addr,_std::allocator<Addr>_> *__x_03;
  pointer pAVar1;
  Addr p;
  pointer pcVar2;
  long lVar3;
  char cVar4;
  uint uVar5;
  pointer __dest;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  size_t __n;
  long lVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x_04;
  long lVar11;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> E;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> P;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  char local_270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  vector<char,_std::allocator<char>_> local_250;
  vector<Addr,_std::allocator<Addr>_> local_238;
  Addr local_220;
  Addr AStack_218;
  char local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_208;
  vector<char,_std::allocator<char>_> local_1f0;
  vector<Addr,_std::allocator<Addr>_> local_1d8;
  Addr local_1c0;
  Addr AStack_1b8;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  char local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  vector<char,_std::allocator<char>_> local_d0;
  vector<Addr,_std::allocator<Addr>_> local_b8;
  Addr local_a0;
  Addr AStack_98;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  
  local_210 = C->NodeState;
  __x_04 = &C->k;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_208,__x_04);
  __x = &C->v;
  std::vector<char,_std::allocator<char>_>::vector(&local_1f0,__x);
  __x_00 = &C->p;
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_1d8,__x_00);
  local_1c0 = C->parent;
  AStack_1b8 = C->self;
  Buffer::Lock(&blocks,AStack_1b8.BlockNum);
  if (local_1d8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_208);
  local_270 = D->NodeState;
  __x_01 = &D->k;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_268,__x_01);
  __x_02 = &D->v;
  std::vector<char,_std::allocator<char>_>::vector(&local_250,__x_02);
  __x_03 = &D->p;
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_238,__x_03);
  local_220 = D->parent;
  AStack_218 = D->self;
  Buffer::Lock(&blocks,AStack_218.BlockNum);
  if (local_238.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_238.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_250.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_250.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_250.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode(&local_330,this->N);
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode(&local_90,this->N);
  local_f0 = C->NodeState;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e8,__x_04);
  std::vector<char,_std::allocator<char>_>::vector(&local_d0,__x);
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_b8,__x_00);
  cVar4 = local_f0;
  local_a0 = C->parent;
  AStack_98 = C->self;
  if (local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  iVar6 = this->N;
  uVar5 = iVar6 - 1;
  if (cVar4 == '1') {
    if (iVar6 < 2) {
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      do {
        if ((__x_02->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar7] != '1') {
          uVar5 = (uint)uVar7;
          break;
        }
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
      uVar7 = (ulong)uVar5;
    }
    if (*(__x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_start == '1') {
      lVar10 = 0;
      lVar8 = 0;
      do {
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((long)&(__x_01->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p +
                   lVar10));
        (__x_03->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.super__Vector_impl_data.
        _M_start[uVar7 + lVar8] =
             (__x_00->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar8];
        (__x_02->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_start[lVar8 + uVar7] =
             (__x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start[lVar8];
        lVar10 = lVar10 + 0x20;
        lVar11 = lVar8 + 1;
        lVar8 = lVar8 + 1;
      } while ((__x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar11] == '1');
    }
    (__x_03->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.super__Vector_impl_data.
    _M_start[(long)this->N + -1] =
         (__x_00->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.super__Vector_impl_data.
         _M_start[(long)this->N + -1];
  }
  else {
    uVar7 = 0;
    if (1 < iVar6) {
      uVar7 = 0;
      do {
        if ((__x_02->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar7] != '1') goto LAB_0013eefd;
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
      uVar7 = (ulong)uVar5;
    }
LAB_0013eefd:
    uVar7 = uVar7 & 0xffffffff;
    std::__cxx11::string::_M_assign
              ((string *)
               ((__x_01->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + uVar7));
    (__x_02->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_start[uVar7] = '1';
    lVar8 = uVar7 + 1;
    if (*(__x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_start == '1') {
      lVar9 = 0;
      lVar11 = 0;
      do {
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((long)&(__x_01->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[lVar8]._M_dataplus._M_p +
                   lVar9));
        (__x_03->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.super__Vector_impl_data.
        _M_start[lVar8 + lVar11] =
             (__x_00->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar11];
        (__x_02->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_start[lVar11 + lVar8] =
             (__x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start[lVar11];
        lVar10 = lVar11 + 1;
        lVar9 = lVar9 + 0x20;
        lVar3 = lVar11 + 1;
        lVar11 = lVar10;
      } while ((__x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar3] == '1');
      iVar6 = (int)lVar10;
    }
    else {
      iVar6 = 0;
      lVar10 = 0;
    }
    (__x_03->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.super__Vector_impl_data.
    _M_start[(uint)((int)lVar8 + iVar6)] =
         (__x_00->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.super__Vector_impl_data.
         _M_start[lVar10];
    if (0 < this->N) {
      lVar8 = 0;
      do {
        pAVar1 = (__x_00->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pAVar1[lVar8].FileOff == -1) break;
        FindNode(this,pAVar1[lVar8],&local_330);
        local_330.parent = D->self;
        local_2d0.NodeState = local_330.NodeState;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_2d0.k,&local_330.k);
        local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        uVar7 = (long)local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        if (uVar7 == 0) {
          __dest = (pointer)0x0;
        }
        else {
          if ((long)uVar7 < 0) {
            std::__throw_bad_alloc();
          }
          __dest = (pointer)operator_new(uVar7);
        }
        local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = __dest + uVar7;
        __n = (long)local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = __dest;
        if (__n != 0) {
          local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = __dest;
          memmove(__dest,local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,__n);
        }
        local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = __dest + __n;
        std::vector<Addr,_std::allocator<Addr>_>::vector(&local_2d0.p,&local_330.p);
        local_2d0.parent = local_330.parent;
        local_2d0.self = local_330.self;
        UpdateBlock(this,&local_2d0);
        if (local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_2d0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_2d0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_2d0.k);
        lVar8 = lVar8 + 1;
      } while (lVar8 < this->N);
    }
  }
  local_150.NodeState = C->NodeState;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_150.k,__x_04);
  std::vector<char,_std::allocator<char>_>::vector(&local_150.v,__x);
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_150.p,__x_00);
  local_150.parent = C->parent;
  local_150.self = C->self;
  UpdateBlock(this,&local_150);
  if (local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_150.k);
  local_1b0.NodeState = D->NodeState;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1b0.k,__x_01);
  std::vector<char,_std::allocator<char>_>::vector(&local_1b0.v,__x_02);
  std::vector<Addr,_std::allocator<Addr>_>::vector(&local_1b0.p,__x_03);
  local_1b0.parent = D->parent;
  local_1b0.self = D->self;
  UpdateBlock(this,&local_1b0);
  if (local_1b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0.k);
  p = C->self;
  FindNode(this,C->parent,&local_90);
  pcVar2 = (k2->_M_dataplus)._M_p;
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_350,pcVar2,pcVar2 + k2->_M_string_length);
  Delete_Aux(this,&local_90,&local_350,C->self);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  FindNode(this,p,&local_330);
  DeleteNode(this,&local_330);
  if (local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.k);
  if (local_330.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_330.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_330.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_330.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_330.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_330.k);
  return;
}

Assistant:

void BpTree<K>::Coalesce(IndexNode<K>& C, IndexNode<K>& D, K k2) {
	this->LockNode(C);
	this->LockNode(D);
	IndexNode<K> E(N);
	IndexNode<K> P(N);
	int m, pos;
	if (!this->IsLeaf(C)) {
		//��Ҷ�ڵ�֮��ĺϲ�
		for (pos = 0; pos < N - 1 && D.v[pos] == '1'; pos++);	//D.k[pos]�ǿյģ�D.p[pos+1]�ǿյ�
		D.k[pos] = k2;
		D.v[pos] = '1';
		pos++;
		for (m = 0; C.v[m] == '1'; m++) {
			D.k[pos + m] = C.k[m];
			D.p[pos + m] = C.p[m];
			D.v[pos + m] = C.v[m];
		}
		D.p[pos + m] = C.p[m];
		for (m = 0; m < N && C.p[m].FileOff != -1; m++) {
			this->FindNode(C.p[m], E);
			E.parent = D.self;
			this->UpdateBlock(E);
		}
	}
	else {
		//Ҷ�ڵ�֮��ĺϲ�
		for (pos = 0; pos < N - 1 && D.v[pos] == '1'; pos++);	//D.k[pos]�ǿյģ�D.p[pos]�ǿյ�
		for (m = 0; C.v[m] == '1'; m++) {
			D.k[pos + m] = C.k[m];
			D.p[pos + m] = C.p[m];
			D.v[pos + m] = C.v[m];
		}
		D.p[N - 1] = C.p[N - 1];
	}
	this->UpdateBlock(C);
	this->UpdateBlock(D);
	Addr temp_p = C.self;
	this->FindNode(C.parent, P);
	this->Delete_Aux(P, k2, C.self);
	this->FindNode(temp_p, E);
	this->DeleteNode(E);
	return;
}